

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O3

int cd_named_type_init(parser_info *info,char **attr)

{
  node_info *pnVar1;
  int iVar2;
  char *name;
  coda_type *pcVar3;
  int iVar4;
  
  name = get_mandatory_attribute_value(attr,"id",info->node->tag);
  iVar4 = -1;
  if (name != (char *)0x0) {
    info->node->free_data = coda_type_release;
    if (info->product_class == (coda_product_class *)0x0) {
      __assert_fail("info->product_class != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                    ,0x766,"int cd_named_type_init(parser_info *, const char **)");
    }
    iVar2 = coda_product_class_has_named_type(info->product_class,name);
    if ((iVar2 == 0) &&
       (iVar2 = parse_entry(info->zf,ze_type,name,info->product_class,info->product_definition),
       iVar2 != 0)) {
      info->add_error_location = 0;
      return -1;
    }
    pcVar3 = coda_product_class_get_named_type(info->product_class,name);
    if (pcVar3 == (coda_type *)0x0) {
      coda_set_error(-400,"named type definition for \'%s\' is empty",name);
    }
    else {
      pcVar3->retain_count = pcVar3->retain_count + 1;
      pnVar1 = info->node;
      pnVar1->format = pcVar3->format;
      pnVar1->format_set = 1;
      pnVar1->data = pcVar3;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static int cd_named_type_init(parser_info *info, const char **attr)
{
    coda_type *type;
    const char *id;

    id = get_mandatory_attribute_value(attr, "id", info->node->tag);
    if (id == NULL)
    {
        return -1;
    }
    info->node->free_data = (free_data_handler)coda_type_release;
    assert(info->product_class != NULL);
    if (get_named_type(info, id, &type) != 0)
    {
        return -1;
    }
    info->node->format = type->format;
    info->node->format_set = 1;
    info->node->data = type;

    return 0;
}